

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::push_integer(Simulator *this,PCode *code)

{
  bool bVar1;
  Symbol *pSVar2;
  simulator_error *this_00;
  string *str;
  int local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [32];
  pointer local_d8;
  pointer local_c8;
  pointer pdStack_c0;
  pointer local_b8;
  Symbol symbol;
  
  str = &code->first_;
  bVar1 = Recognition::is_integer(str);
  if (bVar1) {
    symbol.name_._M_string_length._0_4_ = std::__cxx11::stoi(str,(size_t *)0x0,10);
    symbol.name_._M_dataplus._M_p._0_4_ = 0;
    symbol.name_.field_2._M_allocated_capacity = 0;
    symbol.name_.field_2._8_8_ = 0;
    symbol.type_ = kNone;
    symbol.ret_type_ = kNone;
    symbol.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    symbol.value_.args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    symbol.value_.int_value = 0;
    symbol.value_._28_4_ = 0;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,(StackSymbol *)&symbol);
    StackSymbol::UnionValue::~UnionValue(&symbol.name_._M_string_length);
  }
  else {
    pSVar2 = ScopeTree::resolve(&this->tree_,str);
    Symbol::Symbol(&symbol,pSVar2);
    if (symbol.is_assigned_ != true) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_11c = this->eip_;
      std::operator+(&local_118,anon_var_dwarf_8b1aa + 0xf,str);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     &local_118,anon_var_dwarf_acc0);
      simulator_error::simulator_error(this_00,&local_11c,(string *)local_f8);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    local_f8._0_4_ = kInt;
    local_d8 = (pointer)0x0;
    local_f8._16_8_ = (pointer)0x0;
    local_f8._24_8_ = (pointer)0x0;
    local_b8 = (pointer)0x0;
    local_c8 = (pointer)0x0;
    pdStack_c0 = (pointer)0x0;
    local_f8._8_4_ = symbol.value_.int_value;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,(StackSymbol *)local_f8);
    StackSymbol::UnionValue::~UnionValue(local_f8 + 8);
    Symbol::~Symbol(&symbol);
  }
  this->eip_ = this->eip_ + 1;
  return;
}

Assistant:

void Simulator::push_integer(const PCode &code) {
    if (Recognition::is_integer(code.first())) {
        stack_.push_back(StackSymbol(std::stoi(code.first())));
    } else {
        Symbol symbol = tree_.resolve(code.first());
        if (symbol.is_assigned()) {
            stack_.push_back(StackSymbol(symbol.int_value()));
        } else {
            throw simulator_error(eip(), "变量 \"" + code.first() + "\" 未初始化而直接使用");
        }
    }
    inc_eip();
}